

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::TopLevelASVkImpl::TopLevelASVkImpl
          (TopLevelASVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,TopLevelASDesc *Desc)

{
  Uint32 *Args;
  TopLevelASDesc *Args_1;
  undefined1 *puVar1;
  VulkanPhysicalDevice *this_00;
  VulkanLogicalDevice *this_01;
  VkDeviceSize VVar2;
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
  *this_02;
  VkBuildAccelerationStructureFlagsKHR VVar3;
  uint32_t MemoryTypeIndex;
  VkResult errorCode;
  ulong uVar4;
  VkDeviceAddress VVar5;
  char *Args_2;
  VkMemoryRequirements MemReqs;
  VkAccelerationStructureCreateInfoKHR vkAccelStrCI;
  uint32_t MaxPrimitiveCount;
  VkBufferCreateInfo vkBuffCI;
  char (*in_stack_fffffffffffffea8) [3];
  undefined1 local_148 [32];
  Uint64 local_128;
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
  *local_118;
  VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [88];
  AccelStructWrapper local_a0;
  undefined1 local_88 [24];
  VkDeviceSize VStack_70;
  VkAccelerationStructureKHR local_68;
  VkAccelerationStructureKHR pVStack_60;
  uint32_t *local_58;
  VkAccelerationStructureGeometryKHR *pVStack_50;
  VkAccelerationStructureGeometryKHR **local_48;
  VkDeviceOrHostAddressKHR VStack_40;
  
  TopLevelASBase<Diligent::EngineVkImplTraits>::TopLevelASBase
            (&this->super_TopLevelASBase<Diligent::EngineVkImplTraits>,pRefCounters,pRenderDeviceVk,
             Desc,false);
  (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
  .super_ObjectBase<Diligent::ITopLevelASVk>.super_RefCountedObject<Diligent::ITopLevelASVk>.
  super_ITopLevelASVk.super_ITopLevelAS.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_009393a0;
  local_118 = &this->m_VulkanTLAS;
  local_110 = &this->m_VulkanBuffer;
  this->m_DeviceAddress = 0;
  (this->m_VulkanTLAS).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VulkanTLAS).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VulkanTLAS).m_VkObject = (VkAccelerationStructureKHR_T *)0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VulkanBuffer).m_VkObject = (VkBuffer_T *)0x0;
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  this->m_MemoryAlignedOffset = 0;
  this_00 = (pRenderDeviceVk->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  this_01 = (pRenderDeviceVk->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_f8._80_8_ =
       (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
       .m_Desc.CompactedSize;
  if ((VkAllocationCallbacks *)local_f8._80_8_ == (VkAllocationCallbacks *)0x0) {
    local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f8._16_8_ = (VkDevice)0x0;
    local_f8._64_4_ = 0;
    local_f8._68_4_ = 0;
    local_f8._72_4_ = 0;
    local_f8._76_4_ = 0;
    local_f8._48_4_ = 0;
    local_f8._52_4_ = 0;
    local_f8._56_4_ = 0;
    local_f8._60_4_ = 0;
    local_f8._32_4_ = 0;
    local_f8._36_4_ = 0;
    local_f8._40_8_ = 0;
    local_108._0_8_ = (element_type *)0x3b9d13f6;
    local_f8._0_8_ = (VkBuffer_T *)0x2;
    local_f8._8_8_ = 0x3b9d13f4;
    local_f8._24_8_ = (VkAllocationCallbacks *)0x0;
    local_88._8_8_ = (void *)0x0;
    local_48 = (VkAccelerationStructureGeometryKHR **)0x0;
    VStack_40.deviceAddress = 0;
    local_58 = (uint32_t *)0x0;
    pVStack_50 = (VkAccelerationStructureGeometryKHR *)0x0;
    local_68 = (VkAccelerationStructureKHR)0x0;
    pVStack_60 = (VkAccelerationStructureKHR)0x0;
    local_88._16_4_ = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
    local_88._20_4_ = 0;
    VStack_70 = 0;
    local_88._0_8_ = 0x3b9d13f0;
    VVar3 = BuildASFlagsToVkBuildAccelerationStructureFlags
                      ((this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                       .m_Desc.Flags);
    local_88._16_8_ = (ulong)VVar3 << 0x20;
    pVStack_50 = (VkAccelerationStructureGeometryKHR *)local_108;
    local_58 = (uint32_t *)CONCAT44(local_58._4_4_,1);
    Args = &(this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
            .m_Desc.MaxInstanceCount;
    if ((pRenderDeviceVk->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
        MaxInstancesPerTLAS <
        (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
        .m_Desc.MaxInstanceCount) {
      FormatString<char[21],unsigned_int,char[25],unsigned_int,char[3]>
                ((string *)local_148,(Diligent *)"Max instance count (",(char (*) [21])Args,
                 (uint *)") exceeds device limit (",
                 (char (*) [25])
                 &(pRenderDeviceVk->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                  MaxInstancesPerTLAS,(uint *)0x773e90,in_stack_fffffffffffffea8);
      DebugAssertionFailed
                ((Char *)local_148._0_8_,"TopLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
                 ,0x40);
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
    }
    local_148._8_8_ = (element_type *)0x0;
    local_148._16_8_ = 0;
    local_148._24_8_ = 0;
    local_128 = 0;
    local_148._0_8_ = (Char *)0x3b9d1404;
    local_a0.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             CONCAT44(local_a0.m_pLogicalDevice.
                      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._4_4_,*Args);
    VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureBuildSizes
              (this_01,(VkAccelerationStructureBuildGeometryInfoKHR *)local_88,(uint32_t *)&local_a0
               ,(VkAccelerationStructureBuildSizesInfoKHR *)local_148);
    (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize.Build = local_128;
    (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize.Update =
         local_148._24_8_;
    local_f8._80_8_ = local_148._16_8_;
  }
  Args_1 = &(this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
            .m_Desc;
  local_88._8_8_ = (void *)0x0;
  local_58 = (uint32_t *)0x0;
  local_88._0_8_ = 0xc;
  local_88._16_4_ = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
  local_88._20_4_ = 0;
  local_68 = (VkAccelerationStructureKHR)&__DT_RELA[0x316].r_addend;
  pVStack_60 = (VkAccelerationStructureKHR)0x0;
  VStack_70 = local_f8._80_8_;
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)local_108,this_01,(VkBufferCreateInfo *)local_88,
             (Args_1->super_DeviceObjectAttribs).Name);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(local_110,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_108);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_108)
  ;
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            ((VkMemoryRequirements *)local_148,this_01,(this->m_VulkanBuffer).m_VkObject);
  MemoryTypeIndex =
       VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex(this_00,local_148._16_4_,1);
  puVar1 = (undefined1 *)
           ((long)&(((element_type *)(local_148._8_8_ + -0x410))->m_SupportedAccessMask).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  if ((undefined1 *)(local_148._8_8_ ^ (ulong)puVar1) <= puVar1) {
    FormatString<char[29]>((string *)local_108,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              ((Char *)local_108._0_8_,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x5b);
    if ((element_type *)local_108._0_8_ != (element_type *)local_f8) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_f8._0_8_ + 1));
    }
  }
  Args_2 = (char *)(ulong)MemoryTypeIndex;
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)local_108,pRenderDeviceVk,local_148._0_8_,local_148._8_8_,
             MemoryTypeIndex,2);
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)local_108._0_8_;
  (this->m_MemoryAllocation).UnalignedOffset = local_108._8_8_;
  (this->m_MemoryAllocation).Size = local_f8._0_8_;
  local_108._0_8_ = (element_type *)0x0;
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8._0_8_ = (VkBuffer_T *)0x0;
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
            ((VulkanMemoryAllocation *)local_108);
  if ((this->m_MemoryAllocation).Page == (VulkanMemoryPage *)0x0) {
    Args_2 = "Failed to allocate memory for TLAS \'";
    LogError<true,char[37],char_const*,char[3]>
              (false,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x5e,(char (*) [37])"Failed to allocate memory for TLAS \'",(char **)Args_1,
               (char (*) [3])"\'.");
  }
  VVar2 = (this->m_MemoryAllocation).UnalignedOffset;
  local_a0.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_148._8_8_;
  puVar1 = (undefined1 *)
           ((long)&(((element_type *)(local_148._8_8_ + -0x410))->m_SupportedAccessMask).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  if ((undefined1 *)(local_148._8_8_ ^ (ulong)puVar1) <= puVar1) {
    FormatString<char[12],unsigned_long,char[23]>
              ((string *)local_108,(Diligent *)"Alignment (",(char (*) [12])&local_a0,
               (unsigned_long *)") must be a power of 2",(char (*) [23])Args_2);
    DebugAssertionFailed
              ((Char *)local_108._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((element_type *)local_108._0_8_ != (element_type *)local_f8) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_f8._0_8_ + 1));
    }
  }
  this_02 = local_118;
  uVar4 = -(long)local_a0.m_pLogicalDevice.
                 super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr &
          (long)local_a0.m_pLogicalDevice.
                super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr + (VVar2 - 1);
  this->m_MemoryAlignedOffset = uVar4;
  if ((Char *)(this->m_MemoryAllocation).Size <
      (Char *)(local_148._0_8_ + (uVar4 - (this->m_MemoryAllocation).UnalignedOffset))) {
    FormatString<char[39]>
              ((string *)local_108,(char (*) [39])"Size of memory allocation is too small");
    DebugAssertionFailed
              ((Char *)local_108._0_8_,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x61);
    if ((element_type *)local_108._0_8_ != (element_type *)local_f8) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_f8._0_8_ + 1));
    }
  }
  errorCode = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_01,(this->m_VulkanBuffer).m_VkObject,
                         (((this->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject,
                         this->m_MemoryAlignedOffset);
  if (errorCode != VK_SUCCESS) {
    local_108._0_8_ = VulkanUtilities::VkResultToString(errorCode);
    LogError<true,char[29],char[17],char_const*>
              (false,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,100,(char (*) [29])"Failed to bind buffer memory",(char (*) [17])"\nVK Error Code: "
               ,(char **)local_108);
  }
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8._40_8_ = 0;
  local_108._0_8_ = (element_type *)0x3b9d1401;
  local_f8._0_8_ = (VkBuffer_T *)0x0;
  local_f8._8_8_ = (this->m_VulkanBuffer).m_VkObject;
  local_f8._16_8_ = (VkDevice)0x0;
  local_f8._24_8_ = local_f8._80_8_;
  local_f8._32_4_ = 0;
  local_f8._36_4_ = 0;
  VulkanUtilities::VulkanLogicalDevice::CreateAccelStruct
            (&local_a0,this_01,(VkAccelerationStructureCreateInfoKHR *)local_108,
             (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  operator=(this_02,&local_a0);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  ~VulkanObjectWrapper(&local_a0);
  VVar5 = VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress
                    (this_01,(this->m_VulkanTLAS).m_VkObject);
  this->m_DeviceAddress = VVar5;
  (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_BUILD_AS_READ;
  return;
}

Assistant:

TopLevelASVkImpl::TopLevelASVkImpl(IReferenceCounters*   pRefCounters,
                                   RenderDeviceVkImpl*   pRenderDeviceVk,
                                   const TopLevelASDesc& Desc) :
    TTopLevelASBase{pRefCounters, pRenderDeviceVk, Desc}
{
    const auto& LogicalDevice   = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    const auto& RTProps         = pRenderDeviceVk->GetAdapterInfo().RayTracing;
    auto        AccelStructSize = m_Desc.CompactedSize;

    if (AccelStructSize == 0)
    {
        VkAccelerationStructureGeometryKHR vkGeometry{};
        vkGeometry.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
        vkGeometry.geometryType = VK_GEOMETRY_TYPE_INSTANCES_KHR;

        VkAccelerationStructureGeometryInstancesDataKHR& vkInstances{vkGeometry.geometry.instances};
        vkInstances.sType           = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_INSTANCES_DATA_KHR;
        vkInstances.arrayOfPointers = VK_FALSE;

        VkAccelerationStructureBuildGeometryInfoKHR vkBuildInfo{};
        vkBuildInfo.sType         = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
        vkBuildInfo.flags         = BuildASFlagsToVkBuildAccelerationStructureFlags(m_Desc.Flags);
        vkBuildInfo.type          = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
        vkBuildInfo.pGeometries   = &vkGeometry;
        vkBuildInfo.geometryCount = 1;

        DEV_CHECK_ERR(m_Desc.MaxInstanceCount <= RTProps.MaxInstancesPerTLAS,
                      "Max instance count (", m_Desc.MaxInstanceCount, ") exceeds device limit (", RTProps.MaxInstancesPerTLAS, ").");

        VkAccelerationStructureBuildSizesInfoKHR vkSizeInfo{};
        vkSizeInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;

        const uint32_t MaxPrimitiveCount = m_Desc.MaxInstanceCount;
        LogicalDevice.GetAccelerationStructureBuildSizes(vkBuildInfo, &MaxPrimitiveCount, vkSizeInfo);

        AccelStructSize      = vkSizeInfo.accelerationStructureSize;
        m_ScratchSize.Build  = vkSizeInfo.buildScratchSize;
        m_ScratchSize.Update = vkSizeInfo.updateScratchSize;
    }

    VkBufferCreateInfo vkBuffCI{};
    vkBuffCI.sType                 = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    vkBuffCI.flags                 = 0;
    vkBuffCI.size                  = AccelStructSize;
    vkBuffCI.usage                 = VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_STORAGE_BIT_KHR | VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
    vkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    vkBuffCI.queueFamilyIndexCount = 0;
    vkBuffCI.pQueueFamilyIndices   = nullptr;

    m_VulkanBuffer = LogicalDevice.CreateBuffer(vkBuffCI, m_Desc.Name);

    VkMemoryRequirements MemReqs         = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);
    uint32_t             MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

    VERIFY(IsPowerOfTwo(MemReqs.alignment), "Alignment is not power of 2!");
    m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, MemReqs.alignment, MemoryTypeIndex, VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for TLAS '", m_Desc.Name, "'.");

    m_MemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, MemReqs.alignment);
    VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_MemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
    auto Memory = m_MemoryAllocation.Page->GetVkMemory();
    auto err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_MemoryAlignedOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

    VkAccelerationStructureCreateInfoKHR vkAccelStrCI{};
    vkAccelStrCI.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
    vkAccelStrCI.createFlags = 0;
    vkAccelStrCI.buffer      = m_VulkanBuffer;
    vkAccelStrCI.offset      = 0;
    vkAccelStrCI.size        = AccelStructSize;
    vkAccelStrCI.type        = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;

    m_VulkanTLAS = LogicalDevice.CreateAccelStruct(vkAccelStrCI, m_Desc.Name);

    m_DeviceAddress = LogicalDevice.GetAccelerationStructureDeviceAddress(m_VulkanTLAS);

    SetState(RESOURCE_STATE_BUILD_AS_READ);
}